

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_passes
          (Impl *this,StateCreatorInterface *iface,Value *passes)

{
  VkRenderPassCreateInfo *pVVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint64_t uVar2;
  VkRenderPassCreateInfo *pVVar3;
  bool bVar4;
  char cVar5;
  SizeType SVar6;
  uint uVar7;
  ConstMemberIterator this_01;
  ConstMemberIterator CVar8;
  Ch *str;
  size_type sVar9;
  Type pGVar10;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_02;
  Hash hash;
  ulong local_68;
  uint64_t local_60;
  StateCreatorInterface *local_58;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  VkRenderPassCreateInfo *local_40;
  Value *local_38;
  
  local_58 = iface;
  SVar6 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(passes);
  local_40 = ScratchAllocator::allocate_n_cleared<VkRenderPassCreateInfo>
                       (&this->allocator,(ulong)SVar6);
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberBegin(passes);
  this_02 = &(this->replayed_samplers)._M_h;
  local_50 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->replayed_render_passes;
  local_68 = 0;
  local_48 = this_02;
  local_38 = passes;
  while( true ) {
    CVar8 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(passes);
    if (this_01.ptr_ == CVar8.ptr_) break;
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(&(this_01.ptr_)->name);
    local_60 = string_to_uint64(str);
    sVar9 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(this_02,&local_60);
    pVVar3 = local_40;
    if (sVar9 == 0) {
      this_00 = &(this_01.ptr_)->value;
      pVVar1 = local_40 + local_68;
      local_40[local_68].sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
      pGVar10 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)this_00,"flags");
      uVar7 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar10);
      pVVar3[local_68].flags = uVar7;
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"attachments");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"attachments");
        SVar6 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->attachmentCount = SVar6;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"attachments");
        parse_render_pass_attachments(this,pGVar10,&pVVar1->pAttachments);
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"dependencies");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"dependencies");
        SVar6 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->dependencyCount = SVar6;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"dependencies");
        parse_render_pass_dependencies(this,pGVar10,&pVVar1->pDependencies);
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"subpasses");
      passes = local_38;
      this_02 = local_48;
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"subpasses");
        SVar6 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->subpassCount = SVar6;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"subpasses");
        parse_render_pass_subpasses(this,pGVar10,&pVVar1->pSubpasses);
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"pNext");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"pNext");
        bVar4 = parse_pnext_chain(this,pGVar10,&pVVar1->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar4) goto LAB_00113b20;
      }
      uVar2 = local_60;
      std::__detail::
      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[](local_50,&local_60);
      cVar5 = (**(code **)(*(long *)local_58 + 0x48))(local_58,uVar2,pVVar1);
      if (cVar5 == '\0') goto LAB_00113b20;
    }
    this_01.ptr_ = this_01.ptr_ + 1;
    local_68 = (ulong)((int)local_68 + 1);
  }
  (**(code **)(*(long *)local_58 + 0x88))();
LAB_00113b20:
  return this_01.ptr_ == CVar8.ptr_;
}

Assistant:

bool StateReplayer::Impl::parse_render_passes(StateCreatorInterface &iface, const Value &passes)
{
	auto *infos = allocator.allocate_n_cleared<VkRenderPassCreateInfo>(passes.MemberCount());

	unsigned index = 0;
	for (auto itr = passes.MemberBegin(); itr != passes.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_samplers.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("attachments"))
		{
			info.attachmentCount = obj["attachments"].Size();
			if (!parse_render_pass_attachments(obj["attachments"], &info.pAttachments))
				return false;
		}

		if (obj.HasMember("dependencies"))
		{
			info.dependencyCount = obj["dependencies"].Size();
			if (!parse_render_pass_dependencies(obj["dependencies"], &info.pDependencies))
				return false;
		}

		if (obj.HasMember("subpasses"))
		{
			info.subpassCount = obj["subpasses"].Size();
			if (!parse_render_pass_subpasses(obj["subpasses"], &info.pSubpasses))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_render_pass(hash, &info, &replayed_render_passes[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}